

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O1

void __thiscall ktxApp::~ktxApp(ktxApp *this)

{
  pointer pcVar1;
  pointer poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_ktxApp = (_func_int **)&PTR___cxa_pure_virtual_0011ea58;
  pcVar1 = (this->short_opts)._M_dataplus._M_p;
  paVar3 = &(this->short_opts).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  poVar2 = (this->option_list).
           super__Vector_base<argparser::option,_std::allocator<argparser::option>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (poVar2 != (pointer)0x0) {
    operator_delete(poVar2,(long)(this->option_list).
                                 super__Vector_base<argparser::option,_std::allocator<argparser::option>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)poVar2);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  paVar3 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual void usage() {
        cerr <<
            "  -h, --help    Print this usage message and exit.\n"
            "  -v, --version Print the version number of this program and exit.\n"
#if defined(_WIN32) && defined(DEBUG)
            "      --ld      Launch Visual Studio deugger at start up.\n"
#endif
            ;
    }